

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O2

int wally_psbt_sign(wally_psbt *psbt,uchar *key,size_t key_len,uint32_t flags)

{
  size_t value_len;
  wally_psbt_input *pwVar1;
  wally_tx *tx;
  uint64_t *puVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  long lVar6;
  uchar *puVar7;
  wally_map *pwVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  size_t scriptcode_len;
  wally_tx_input *local_1d8;
  size_t keypath_index;
  uchar *local_1c8;
  ulong local_1c0;
  wally_psbt_input *local_1b8;
  long local_1b0;
  size_t written;
  size_t is_found;
  wally_map *local_198;
  size_t is_elements;
  uchar signature_hash [32];
  uchar pubkey [33];
  uchar p2sh [23];
  size_t type;
  uchar full_pubkey [65];
  uchar wpkh_sc [25];
  wally_tx_input *pwVar12;
  
  iVar4 = -2;
  if (((((psbt != (wally_psbt *)0x0) && (key != (uchar *)0x0)) && (flags < 0x10)) &&
      ((key_len == 0x20 && (psbt->tx != (wally_tx *)0x0)))) &&
     ((iVar4 = wally_psbt_is_elements(psbt,&is_elements), iVar4 == 0 &&
      ((iVar4 = wally_ec_public_key_from_private_key(key,0x20,pubkey,0x21), iVar4 == 0 &&
       (iVar4 = wally_ec_public_key_decompress(pubkey,0x21,full_pubkey,0x41), iVar4 == 0)))))) {
    lVar9 = 0x48;
    iVar4 = 0;
    local_1b0 = 0;
    for (local_1c0 = 0; local_1c0 < psbt->num_inputs; local_1c0 = local_1c0 + 1) {
      pwVar1 = psbt->inputs;
      local_1d8 = psbt->tx->inputs;
      keypath_index = 0;
      pwVar8 = (wally_map *)((long)&pwVar1->utxo + lVar9);
      iVar5 = wally_map_find(pwVar8,full_pubkey,0x41,&keypath_index);
      if ((iVar5 == 0) && (keypath_index == 0)) {
        iVar5 = wally_map_find(pwVar8,pubkey,0x21,&keypath_index);
      }
      if ((iVar5 == 0) && (keypath_index != 0)) {
        keypath_index = keypath_index - 1;
        pwVar8 = (wally_map *)((long)&pwVar1->redeem_script_len + lVar9);
        local_1b8 = pwVar1;
        iVar5 = wally_map_find(pwVar8,full_pubkey,0x41,&is_found);
        local_198 = pwVar8;
        if (is_found == 0 && iVar5 == 0) {
          iVar5 = wally_map_find(pwVar8,pubkey,0x21,&is_found);
        }
        pwVar1 = local_1b8;
        if ((iVar5 == 0) && (is_found == 0)) {
          if (local_1b8 == (wally_psbt_input *)0x0) {
            return -2;
          }
          scriptcode_len = 0;
          lVar11 = *(long *)((long)local_1b8 + lVar9 + -0x48);
          if (lVar11 == 0) {
            lVar11 = 0;
          }
          else {
            if (*(ulong *)(lVar11 + 0x28) <= (ulong)*(uint *)(local_1d8->txhash + local_1b0 + 0x20))
            {
              return -2;
            }
            lVar11 = (ulong)*(uint *)(local_1d8->txhash + local_1b0 + 0x20) * 0x70 +
                     *(long *)(lVar11 + 0x20);
          }
          lVar6 = *(long *)((long)local_1b8 + lVar9 + -0x40);
          if (lVar6 != 0) {
            lVar11 = lVar6;
          }
          if (lVar11 == 0) {
            return -2;
          }
          puVar7 = *(uchar **)((long)local_1b8 + lVar9 + -0x38);
          if (puVar7 == (uchar *)0x0) {
            puVar7 = *(uchar **)(lVar11 + 8);
            scriptcode_len = *(size_t *)(lVar11 + 0x10);
          }
          else {
            iVar5 = wally_scriptpubkey_p2sh_from_bytes
                              (puVar7,*(size_t *)((long)local_1b8 + lVar9 + -0x30),1,p2sh,0x17,&type
                              );
            if (iVar5 != 0) {
              return -2;
            }
            if (*(size_t *)(lVar11 + 0x10) != type) {
              return -2;
            }
            iVar5 = bcmp(p2sh,*(void **)(lVar11 + 8),*(size_t *)(lVar11 + 0x10));
            if (iVar5 != 0) {
              return -2;
            }
            puVar7 = *(uchar **)((long)pwVar1 + lVar9 + -0x38);
            scriptcode_len = *(size_t *)((long)pwVar1 + lVar9 + -0x30);
            lVar6 = *(long *)((long)pwVar1 + lVar9 + -0x40);
          }
          iVar5 = *(int *)((long)&(pwVar1->keypaths).items + lVar9);
          uVar10 = iVar5 + (uint)(iVar5 == 0);
          pwVar12 = (wally_tx_input *)(ulong)uVar10;
          if (lVar6 == 0) {
            tx = *(wally_tx **)((long)pwVar1 + lVar9 + -0x48);
            if (tx != (wally_tx *)0x0) {
              local_1c8 = puVar7;
              _Var3 = is_matching_txid(tx,local_1d8->txhash + local_1b0,(size_t)&type);
              if (!_Var3) {
                return -2;
              }
              iVar5 = wally_tx_get_btc_signature_hash
                                (psbt->tx,local_1c0,local_1c8,scriptcode_len,0,uVar10,0,
                                 signature_hash,0x20);
              if (iVar5 != 0) {
                return iVar5;
              }
            }
          }
          else {
            local_1c8 = puVar7;
            iVar5 = wally_scriptpubkey_get_type(puVar7,scriptcode_len,&type);
            if (iVar5 != 0) {
              return iVar5;
            }
            if (type == 0x10) {
              puVar7 = *(uchar **)((long)pwVar1 + lVar9 + -0x28);
              if (puVar7 == (uchar *)0x0) {
                return -2;
              }
              iVar5 = wally_witness_program_from_bytes
                                (puVar7,*(size_t *)((long)pwVar1 + lVar9 + -0x20),2,p2sh,0x22,
                                 &written);
              if (iVar5 != 0) {
                return iVar5;
              }
              if (scriptcode_len != 0x22) {
                return -2;
              }
              iVar5 = bcmp(p2sh,local_1c8,0x22);
              if (iVar5 != 0) {
                return -2;
              }
              puVar7 = *(uchar **)((long)pwVar1 + lVar9 + -0x28);
              scriptcode_len = *(size_t *)((long)pwVar1 + lVar9 + -0x20);
            }
            else {
              if (type != 8) {
                return -2;
              }
              puVar7 = wpkh_sc;
              local_1d8 = pwVar12;
              iVar5 = wally_scriptpubkey_p2pkh_from_bytes
                                (local_1c8 + 2,0x14,0,puVar7,0x19,&scriptcode_len);
              pwVar12 = local_1d8;
              if (iVar5 != 0) {
                return iVar5;
              }
            }
            puVar2 = *(uint64_t **)((long)pwVar1 + lVar9 + -0x40);
            if (is_elements == 0) {
              iVar5 = wally_tx_get_btc_signature_hash
                                (psbt->tx,local_1c0,puVar7,scriptcode_len,*puVar2,(uint32_t)pwVar12,
                                 1,signature_hash,0x20);
            }
            else {
              iVar5 = wally_tx_get_elements_signature_hash
                                (psbt->tx,local_1c0,puVar7,scriptcode_len,(uchar *)puVar2[6],
                                 puVar2[7],(uint32_t)pwVar12,1,signature_hash,0x20);
            }
            if (iVar5 != 0) {
              return iVar5;
            }
          }
          lVar11 = *(long *)((long)&pwVar1->utxo + lVar9);
          local_1d8 = *(wally_tx_input **)(lVar11 + keypath_index * 0x20);
          local_1b8 = *(wally_psbt_input **)(lVar11 + 8 + keypath_index * 0x20);
          uVar10 = *(uint *)((long)&(pwVar1->keypaths).items + lVar9);
          iVar5 = wally_ec_public_key_verify(local_1d8->txhash,(size_t)local_1b8);
          if (0xff < uVar10) {
            return -2;
          }
          if (iVar5 != 0) {
            return -2;
          }
          iVar5 = wally_ec_sig_from_bytes
                            (key,0x20,signature_hash,0x20,(flags & 4) + 1,(uchar *)&type,0x40);
          if (iVar5 != 0) {
            return iVar5;
          }
          iVar5 = wally_ec_sig_to_der((uchar *)&type,0x40,p2sh,0x49,&written);
          if (iVar5 != 0) {
            return iVar5;
          }
          value_len = written + 1;
          p2sh[written] = (char)uVar10 + (uVar10 == 0);
          written = value_len;
          iVar5 = wally_map_add(local_198,local_1d8->txhash,(size_t)local_1b8,p2sh,value_len);
          wally_clear_2(&type,0x40,p2sh,0x49);
          if (iVar5 != 0) {
            return iVar5;
          }
        }
      }
      lVar9 = lVar9 + 0x110;
      local_1b0 = local_1b0 + 0xd0;
    }
  }
  return iVar4;
}

Assistant:

int wally_psbt_sign(struct wally_psbt *psbt,
                    const unsigned char *key, size_t key_len, uint32_t flags)
{
    unsigned char pubkey[EC_PUBLIC_KEY_LEN], full_pubkey[EC_PUBLIC_KEY_UNCOMPRESSED_LEN];
    const size_t pubkey_len = sizeof(pubkey), full_pubkey_len = sizeof(full_pubkey);
    unsigned char wpkh_sc[WALLY_SCRIPTPUBKEY_P2PKH_LEN];
    size_t is_elements, i;
    int ret;

    if (!psbt || !psbt->tx || !key || key_len != EC_PRIVATE_KEY_LEN ||
        (flags & ~EC_FLAGS_ALL)) {
        return WALLY_EINVAL;
    }

    if ((ret = wally_psbt_is_elements(psbt, &is_elements)) != WALLY_OK)
        return ret;
#ifndef BUILD_ELEMENTS
    if (is_elements)
        return WALLY_EINVAL;
#endif /* ndef BUILD_ELEMENTS */

    /* Get the pubkey */
    ret = wally_ec_public_key_from_private_key(key, key_len,
                                               pubkey, pubkey_len);
    if (ret == WALLY_OK)
        ret = wally_ec_public_key_decompress(pubkey, pubkey_len,
                                             full_pubkey, full_pubkey_len);
    if (ret != WALLY_OK)
        return ret;

    /* Go through each of the inputs */
    for (i = 0; i < psbt->num_inputs; ++i) {
        struct wally_psbt_input *input = &psbt->inputs[i];
        struct wally_tx_input *txin = &psbt->tx->inputs[i];
        unsigned char signature_hash[SHA256_LEN];
        const unsigned char *scriptcode;
        size_t keypath_index = 0, scriptcode_len;
        uint32_t sighash;

        /* See if this input has a keypath matching the pubkey of the private key supplied */
        ret = wally_map_find(&input->keypaths, full_pubkey, full_pubkey_len, &keypath_index);
        if (ret == WALLY_OK && !keypath_index)
            ret = wally_map_find(&input->keypaths, pubkey, pubkey_len, &keypath_index);
        if (ret != WALLY_OK)
            continue;

        if (!keypath_index)
            continue; /* Didn't find a keypath matching this pubkey: skip it */
        keypath_index -= 1; /* Use 0 based index below */

        /* Make sure we don't already have a sig for this input */
        size_t is_found;
        ret = wally_map_find(&input->signatures, full_pubkey, full_pubkey_len, &is_found);
        if (ret == WALLY_OK && !is_found)
            ret = wally_map_find(&input->signatures, pubkey, pubkey_len, &is_found);

        if (ret != WALLY_OK || is_found)
            continue; /* Already got a partial sig for this pubkey on this input */

        /* From this point, any failure to sign returns an error, since we
        * have the key to sign this input we are expected to be able to */

        if (!input_get_scriptcode(input, txin->index, &scriptcode, &scriptcode_len))
            return WALLY_EINVAL; /* Couldn't find the script to sign with */

        sighash = input->sighash ? input->sighash : WALLY_SIGHASH_ALL;

        if (input->witness_utxo) {
            size_t type;

            ret = wally_scriptpubkey_get_type(scriptcode, scriptcode_len, &type);
            if (ret != WALLY_OK)
                return ret;

            if (type == WALLY_SCRIPT_TYPE_P2WPKH) {
                ret = wally_scriptpubkey_p2pkh_from_bytes(&scriptcode[2],
                                                          HASH160_LEN, 0,
                                                          wpkh_sc, sizeof(wpkh_sc),
                                                          &scriptcode_len);
                if (ret != WALLY_OK)
                    return ret;

                scriptcode = wpkh_sc;
            } else if (type == WALLY_SCRIPT_TYPE_P2WSH && input->witness_script) {
                unsigned char p2wsh[WALLY_SCRIPTPUBKEY_P2WSH_LEN];
                size_t written;

                ret = wally_witness_program_from_bytes(input->witness_script,
                                                       input->witness_script_len,
                                                       WALLY_SCRIPT_SHA256,
                                                       p2wsh, sizeof(p2wsh),
                                                       &written);
                if (ret != WALLY_OK)
                    return ret;

                if (scriptcode_len != sizeof(p2wsh) ||
                    memcmp(p2wsh, scriptcode, sizeof(p2wsh)))
                    return WALLY_EINVAL;

                scriptcode = input->witness_script;
                scriptcode_len = input->witness_script_len;
            } else
                return WALLY_EINVAL; /* Unknown scriptPubKey type/not enough info */

#ifdef BUILD_ELEMENTS
            if (is_elements)
                ret = wally_tx_get_elements_signature_hash(psbt->tx, i,
                                                           scriptcode, scriptcode_len,
                                                           input->witness_utxo->value,
                                                           input->witness_utxo->value_len,
                                                           sighash,
                                                           WALLY_TX_FLAG_USE_WITNESS,
                                                           signature_hash, SHA256_LEN);
            else
#endif /* BUILD_ELEMENTS */
            ret = wally_tx_get_btc_signature_hash(psbt->tx, i,
                                                  scriptcode, scriptcode_len,
                                                  input->witness_utxo->satoshi,
                                                  sighash,
                                                  WALLY_TX_FLAG_USE_WITNESS,
                                                  signature_hash, SHA256_LEN);
            if (ret != WALLY_OK)
                return ret;
        } else if (input->utxo) {
            if (!is_matching_txid(input->utxo,
                                  txin->txhash, sizeof(txin->txhash)))
                return WALLY_EINVAL; /* prevout doesn't match this input */

            ret = wally_tx_get_btc_signature_hash(psbt->tx, i,
                                                  scriptcode, scriptcode_len,
                                                  0, sighash, 0,
                                                  signature_hash, SHA256_LEN);
            if (ret != WALLY_OK)
                return ret;
        }

        ret = psbt_input_sign(input, key, key_len,
                              input->keypaths.items[keypath_index].key,
                              input->keypaths.items[keypath_index].key_len,
                              signature_hash, SHA256_LEN, flags);
        if (ret != WALLY_OK)
            return ret;
    }

    return WALLY_OK;
}